

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

int enet_socket_get_option(ENetSocket socket,ENetSocketOption option,int *value)

{
  int iVar1;
  int __level;
  socklen_t len;
  
  if (option == ENET_SOCKOPT_TTL) {
    iVar1 = 2;
    __level = 0;
  }
  else {
    if (option != ENET_SOCKOPT_ERROR) {
      iVar1 = -1;
      goto LAB_0010760c;
    }
    __level = 1;
    iVar1 = 4;
  }
  iVar1 = getsockopt(socket,__level,iVar1,value,&len);
LAB_0010760c:
  return -(uint)(iVar1 == -1);
}

Assistant:

int
enet_socket_get_option (ENetSocket socket, ENetSocketOption option, int * value)
{
    int result = -1;
    socklen_t len;
    switch (option)
    {
        case ENET_SOCKOPT_ERROR:
            len = sizeof (int);
            result = getsockopt (socket, SOL_SOCKET, SO_ERROR, value, & len);
            break;

        case ENET_SOCKOPT_TTL:
            len = sizeof (int);
            result = getsockopt (socket, IPPROTO_IP, IP_TTL, (char *) value, & len);
            break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}